

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O0

uint8_t * bstr_to_double(uint8_t *pBegin,uint8_t *pEnd,double *data)

{
  double dVar1;
  uint8_t *retval;
  size_t delta;
  size_t size;
  char *parse_end;
  char tmp [33];
  double *data_local;
  uint8_t *pEnd_local;
  uint8_t *pBegin_local;
  
  size = 0;
  delta = (long)pEnd - (long)pBegin;
  if (0x20 < delta) {
    delta = 0x20;
  }
  memcpy(&parse_end,pBegin,delta);
  tmp[delta - 8] = '\0';
  dVar1 = strtod((char *)&parse_end,(char **)&size);
  *data = dVar1;
  if (&parse_end < size) {
    if (pBegin + (size - (long)&parse_end) <= pEnd) {
      return pBegin + (size - (long)&parse_end);
    }
  }
  else if ((char **)size == &parse_end) {
    return pBegin;
  }
  return (uint8_t *)0x0;
}

Assistant:

const uint8_t* bstr_to_double(const uint8_t* pBegin, const uint8_t* pEnd, double* data)
{
   char tmp[MAX_NUMBER_SIZE+1];   
   char* parse_end = NULL;
   size_t size = pEnd - pBegin;
   if (size > MAX_NUMBER_SIZE)
   {
      size = MAX_NUMBER_SIZE;
   }
   memcpy(&tmp[0], pBegin, size);
   tmp[size]='\0';
   *data = strtod(&tmp[0], &parse_end);
   if (parse_end > &tmp[0] )
   {
      size_t delta = parse_end - &tmp[0];
      const uint8_t* retval = pBegin + delta;
      if (retval <= pEnd)
      {
         return retval;
      }   
   }
   else if (parse_end == &tmp[0])
   {
      return pBegin; //Not a number
   }
   return NULL;
}